

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

int __thiscall
coda_url::create_relative(coda_url *this,char *u,size_t sz,uint32_t flags,coda_url *parent)

{
  bool bVar1;
  char *pcVar2;
  uint in_ECX;
  char *in_RDX;
  coda_url *in_RSI;
  coda_url *in_RDI;
  coda_url *in_R8;
  char *unaff_retaddr;
  undefined4 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd8;
  coda_url *pcVar3;
  uint32_t flags_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  pcVar3 = in_RDI;
  bVar1 = empty(in_RDI);
  flags_00 = (uint32_t)((ulong)pcVar3 >> 0x20);
  if ((((!bVar1) || (in_RDX == (char *)0x0)) || (in_RSI == (coda_url *)0x0)) ||
     (bVar1 = empty(in_R8), bVar1)) {
    reset(in_R8);
    iVar4 = -1;
  }
  else {
    pcVar2 = (char *)malloc((long)in_RDX * 2 + 2 + (ulong)in_R8->val_len + (ulong)in_R8->dom_len);
    in_RDI->val_str = pcVar2;
    pcVar2 = coda_strxstr((char *)sz,(char *)CONCAT44(flags,in_stack_00000010),(size_t)parent);
    if ((pcVar2 == (char *)0x0) &&
       (pcVar2 = coda_strxstr((char *)sz,(char *)CONCAT44(flags,in_stack_00000010),(size_t)parent),
       pcVar2 == (char *)0x0)) {
      iVar4 = create_suburl(parent,unaff_retaddr,
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),flags_00,
                            in_RSI);
      if (iVar4 == -1) {
        reset(in_R8);
        return -1;
      }
    }
    else {
      create_scheme(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                    (uint32_t)((ulong)in_R8 >> 0x20));
      if (((in_ECX & 2) != 0) && (iVar4 = strcasecmp(in_RDI->dom_str,in_R8->dom_str), iVar4 != 0)) {
        reset(in_R8);
        return -1;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int coda_url::create_relative(const char *u, size_t sz, uint32_t flags, const coda_url &parent)
{
	if (!empty() || 0 == sz || NULL == u || parent.empty())
	{
		reset();
		return -1;
	}

	val_str = (char *) malloc(2 + 2 * sz + parent.val_len + parent.dom_len); // if relative, parent may be bigger than u

	if (coda_strxstr(u, "http://", 7) || coda_strxstr(u, "https://", 8))
	{
		create_scheme(u, sz, flags);

		if ((flags & CODA_URL_SUBDOMAIN) && 0 != strcasecmp(dom_str, parent.dom_str))
		{
			reset();
			return -1;
		}
	}
	else
	{
		if (-1 == create_suburl(u, sz, flags, parent))
		{
			reset();
			return -1;
		}
	}

	return 0;
}